

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O3

unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
__thiscall ApplicationFactory::makeContext(ApplicationFactory *this)

{
  _Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  _Var1;
  long *plVar2;
  unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  uVar3;
  int iVar4;
  _Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  _Var5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
  _Var6;
  Button *this_00;
  long lVar7;
  FoundationPileColliders foundationPileColliders;
  TableauPileColliders tableauPileColliders;
  array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
  local_d0;
  uint local_ac;
  PileId local_a8;
  PileId local_a4;
  Button *local_a0;
  array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
  local_98;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_98._M_elems[5]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                    )this;
  makeSolitaire((ApplicationFactory *)&local_d0);
  local_98._M_elems[2]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[3]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[0]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[1]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  lVar7 = 0;
  do {
    local_a4.t = (uint)lVar7;
    local_98._M_elems[6]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                    )solitaire::Layout::getFoundationPilePosition(&local_a4);
    _Var5.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (_Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>)
                   operator_new(0x10);
    solitaire::colliders::FoundationPileCollider::FoundationPileCollider
              ((FoundationPileCollider *)
               _Var5.
               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
               ._M_head_impl,(Position *)(local_98._M_elems + 6));
    _Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = local_98._M_elems[lVar7]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
    ;
    local_98._M_elems[lVar7]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false> =
         _Var5.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
         ._M_head_impl;
    if (_Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
        _M_head_impl != (TableauPileCollider *)0x0) {
      (**(code **)(*(long *)_Var1.
                            super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                            ._M_head_impl + 8))();
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_98._M_elems[6]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  uStack_60 = 0;
  local_38 = 0;
  lVar7 = 0;
  do {
    local_a8.t = (uint)lVar7;
    local_d0._M_elems[1]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
    _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                    )solitaire::Layout::getTableauPilePosition(&local_a8);
    local_ac = (uint)lVar7;
    iVar4 = (*(*(_func_int ***)
                local_d0._M_elems[0]._M_t.
                super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                ._M_t.
                super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                .
                super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                ._M_head_impl)[0xe])
                      (local_d0._M_elems[0]._M_t.
                       super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                       .
                       super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                       ._M_head_impl,&local_ac);
    _Var5.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (_Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>)
                   operator_new(0x18);
    solitaire::colliders::TableauPileCollider::TableauPileCollider
              ((TableauPileCollider *)
               _Var5.
               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
               ._M_head_impl,(Position *)(local_d0._M_elems + 1),
               (TableauPile *)CONCAT44(extraout_var,iVar4));
    _Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = local_98._M_elems[lVar7 + 6]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
    ;
    local_98._M_elems[lVar7 + 6]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false> =
         _Var5.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
         ._M_head_impl;
    if (_Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
        _M_head_impl != (TableauPileCollider *)0x0) {
      (**(code **)(*(long *)_Var1.
                            super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                            ._M_head_impl + 8))();
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  iVar4 = (*(*(_func_int ***)
              local_d0._M_elems[0]._M_t.
              super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
              ._M_t.
              super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
              .
              super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
              ._M_head_impl)[0xf])();
  _Var6.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                  )operator_new(0x10);
  solitaire::colliders::StockPileCollider::StockPileCollider
            ((StockPileCollider *)
             _Var6.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             .
             super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
             ._M_head_impl,(StockPile *)CONCAT44(extraout_var_00,iVar4));
  local_d0._M_elems[3]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                    )_Var6.
                     super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     .
                     super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                     ._M_head_impl;
  _Var6.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                  )operator_new(0x20);
  solitaire::Button::Button
            ((Button *)
             _Var6.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             .
             super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
             ._M_head_impl,&solitaire::Layout::newGameButtonPosition,
             &solitaire::Layout::newGameButtonSize);
  local_d0._M_elems[2]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                    )_Var6.
                     super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     .
                     super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                     ._M_head_impl;
  this_00 = (Button *)operator_new(0x20);
  solitaire::Button::Button
            (this_00,&solitaire::Layout::undoButtonPosition,&solitaire::Layout::undoButtonSize);
  local_a0 = this_00;
  std::
  make_unique<solitaire::Context,std::unique_ptr<solitaire::interfaces::Solitaire,std::default_delete<solitaire::interfaces::Solitaire>>,std::array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>>,4ul>,std::array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>>,7ul>,std::unique_ptr<solitaire::colliders::StockPileCollider,std::default_delete<solitaire::colliders::StockPileCollider>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>>
            ((unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
              *)(local_d0._M_elems + 1),&local_d0,&local_98,
             (unique_ptr<solitaire::colliders::StockPileCollider,_std::default_delete<solitaire::colliders::StockPileCollider>_>
              *)(local_98._M_elems + 6),
             (unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)
             (local_d0._M_elems + 3),
             (unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)
             (local_d0._M_elems + 2));
  uVar3._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = local_98._M_elems[5]._M_t.
                 super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                 .
                 super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                 ._M_head_impl;
  *(__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
    *)local_98._M_elems[5]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
      _M_head_impl =
       local_d0._M_elems[1]._M_t.
       super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
       _M_head_impl;
  local_d0._M_elems[1]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                    )0x0;
  if (local_a0 != (Button *)0x0) {
    (*(local_a0->super_Button)._vptr_Button[1])();
  }
  if (local_d0._M_elems[2]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       )0x0) {
    (*((Button *)
      local_d0._M_elems[2]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl)->_vptr_Button[1])();
  }
  if (local_d0._M_elems[3]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       )0x0) {
    (**(code **)(*(long *)local_d0._M_elems[3]._M_t.
                          super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                          .
                          super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                          ._M_head_impl + 8))();
  }
  lVar7 = 0x30;
  do {
    plVar2 = *(long **)((long)&local_98._M_elems[6]._M_t.
                               super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               .
                               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                               ._M_head_impl + lVar7);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(undefined8 *)
     ((long)&local_98._M_elems[6]._M_t.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
             _M_head_impl + lVar7) = 0;
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  lVar7 = 0x18;
  do {
    plVar2 = *(long **)((long)&local_98._M_elems[0]._M_t.
                               super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               .
                               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                               ._M_head_impl + lVar7);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(undefined8 *)
     ((long)&local_98._M_elems[0]._M_t.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
             _M_head_impl + lVar7) = 0;
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  if ((_Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>)
      local_d0._M_elems[0]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl !=
      (_Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_d0._M_elems[0]._M_t.
        super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
        ._M_t.
        super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
        .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
        _M_head_impl)[1])();
  }
  return (unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
          )(Context *)
           uVar3._M_t.
           super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
           .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
           _M_head_impl;
}

Assistant:

std::unique_ptr<solitaire::interfaces::Context>
ApplicationFactory::makeContext() const
{
    auto solitaire = makeSolitaire();

    Context::FoundationPileColliders foundationPileColliders;
    for (PileId id {0}; id < Solitaire::foundationPilesCount; ++id)
        foundationPileColliders[id] =
            std::make_unique<FoundationPileCollider>(
                Layout::getFoundationPilePosition(id));

    Context::TableauPileColliders tableauPileColliders;
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        tableauPileColliders[id] =
            std::make_unique<TableauPileCollider>(
                Layout::getTableauPilePosition(id), solitaire->getTableauPile(id));

    return std::make_unique<Context>(
        std::move(solitaire), std::move(foundationPileColliders),
        std::move(tableauPileColliders),
        std::make_unique<StockPileCollider>(solitaire->getStockPile()),
        std::make_unique<Button>(
            Layout::newGameButtonPosition, Layout::newGameButtonSize
        ),
        std::make_unique<Button>(
            Layout::undoButtonPosition, Layout::undoButtonSize
        )
    );
}